

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O0

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
relationalExpression(Tokenizer *tokenizer)

{
  bool bVar1;
  Token *pTVar2;
  __uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true> in_RSI;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_48;
  undefined1 local_40 [8];
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  int local_28;
  uint local_24;
  OperatorType op;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  Tokenizer *tokenizer_local;
  
  exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
  super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
  super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       in_RSI.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
       _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
       super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
  shiftExpression((Tokenizer *)&op);
  bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)&op,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
    unique_ptr<std::default_delete<ExpressionInternal>,void>
              ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)tokenizer,
               (nullptr_t)0x0);
    local_24 = 1;
  }
  else {
    do {
      local_28 = 0;
      pTVar2 = Tokenizer::peekToken
                         ((Tokenizer *)
                          exp._M_t.
                          super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                          .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl,0);
      switch(pTVar2->type) {
      case Less:
        local_28 = 0x10;
        break;
      case Greater:
        local_28 = 0x11;
        break;
      case LessEqual:
        local_28 = 0x12;
        break;
      case GreaterEqual:
        local_28 = 0x13;
      }
      if (local_28 == 0) {
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   tokenizer,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&op);
        local_24 = 1;
        break;
      }
      Tokenizer::eatToken((Tokenizer *)
                          exp._M_t.
                          super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                          .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl);
      shiftExpression((Tokenizer *)local_40);
      bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                               *)local_40,(nullptr_t)0x0);
      if (bVar1) {
        std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
        unique_ptr<std::default_delete<ExpressionInternal>,void>
                  ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)
                   tokenizer,(nullptr_t)0x0);
      }
      else {
        std::
        make_unique<ExpressionInternal,OperatorType&,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)&local_48,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   &stack0xffffffffffffffd8,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&op);
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::operator=
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&op,
                   &local_48);
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  (&local_48);
      }
      local_24 = (uint)bVar1;
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_40);
    } while (local_24 == 0);
  }
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&op);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> relationalExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = shiftExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (true)
	{
		OperatorType op = OperatorType::Invalid;
		switch (tokenizer.peekToken().type)
		{
		case TokenType::Less:
			op = OperatorType::Less;
			break;
		case TokenType::LessEqual:
			op = OperatorType::LessEqual;
			break;
		case TokenType::Greater:
			op = OperatorType::Greater;
			break;
		case TokenType::GreaterEqual:
			op = OperatorType::GreaterEqual;
			break;
		default:
			break;
		}

		if (op == OperatorType::Invalid)
			break;

		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = shiftExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;
		exp = std::make_unique<ExpressionInternal>(op, std::move(exp), std::move(exp2));
	}

	return exp;
}